

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_pitch_slide(xm_context_t *ctx,xm_channel_context_t *ch,float period_offset)

{
  uint8_t *puVar1;
  xm_context_t *in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (*(int *)(in_RDI + 0x14) == 0) {
    in_XMM0_Da = in_XMM0_Da * 4.0;
  }
  *(float *)((in_RSI->module).pattern_table + 0xc) =
       in_XMM0_Da + *(float *)((in_RSI->module).pattern_table + 0xc);
  puVar1 = (in_RSI->module).pattern_table + 0xc;
  if (*(float *)puVar1 <= 0.0 && *(float *)puVar1 != 0.0) {
    (in_RSI->module).pattern_table[0xc] = '\0';
    (in_RSI->module).pattern_table[0xd] = '\0';
    (in_RSI->module).pattern_table[0xe] = '\0';
    (in_RSI->module).pattern_table[0xf] = '\0';
  }
  xm_update_frequency(in_RSI,(xm_channel_context_t *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8))
  ;
  return;
}

Assistant:

static void xm_pitch_slide(xm_context_t* ctx, xm_channel_context_t* ch, float period_offset) {
	/* Don't ask about the 4.f coefficient. I found mention of it
	 * nowhere. Found by ear™. */
	if(ctx->module.frequency_type == XM_LINEAR_FREQUENCIES) {
		period_offset *= 4.f;
	}

	ch->period += period_offset;
	XM_CLAMP_DOWN(ch->period);
	/* XXX: upper bound of period ? */

	xm_update_frequency(ctx, ch);
}